

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O1

void __thiscall
TransitionObservationIndependentMADPDiscrete::JointToIndividualActionIndices
          (TransitionObservationIndependentMADPDiscrete *this)

{
  Scope *in_RCX;
  Index in_EDX;
  long *in_RSI;
  
  JointToIndividualActionIndices
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
             (TransitionObservationIndependentMADPDiscrete *)
             ((long)in_RSI + *(long *)(*in_RSI + -0xc0)),in_EDX,in_RCX);
  return;
}

Assistant:

std::vector<Index> JointToIndividualActionIndices(
        Index ja_e, const Scope& agSC) const
        { 
            // identical to MADPComponentDiscreteActions
            std::vector<size_t> nr_A_e(agSC.size());
            IndexTools::RestrictIndividualIndicesToScope(
                GetNrActions(), agSC, nr_A_e);
            std::vector<Index> ja_e_vec = IndexTools::JointToIndividualIndices(ja_e, nr_A_e);
            return(ja_e_vec);
        }